

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O3

UpvalueData * __thiscall
IntrusiveList<UpvalueData>::operator[](IntrusiveList<UpvalueData> *this,uint index)

{
  UpvalueData *pUVar1;
  uint uVar2;
  
  pUVar1 = this->head;
  uVar2 = index;
  if (pUVar1 != (UpvalueData *)0x0 && index != 0) {
    do {
      index = uVar2 - 1;
      pUVar1 = pUVar1->next;
      if (uVar2 == 1) break;
      uVar2 = index;
    } while (pUVar1 != (UpvalueData *)0x0);
  }
  if (index == 0) {
    return pUVar1;
  }
  __assert_fail("index == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x3f,
                "T *IntrusiveList<UpvalueData>::operator[](unsigned int) const [T = UpvalueData]");
}

Assistant:

T* operator[](unsigned index) const
	{
		T *curr = head;

		while(index && curr)
		{
			curr = curr->next;
			index--;
		}

		assert(index == 0);

		return curr;
	}